

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShallowSerializer.hpp
# Opt level: O1

void supermap::io::ShallowSerializer<char>::serialize(char *value,ostream *os)

{
  long lVar1;
  long lVar2;
  IOException *this;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  lVar1 = std::ostream::tellp();
  std::ostream::write((char *)os,(long)value);
  lVar2 = std::ostream::tellp();
  if (lVar2 - lVar1 == 1) {
    return;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_88,1);
  std::operator+(&local_68,"Attempted to write ",&local_88);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_e8._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_e8._M_dataplus._M_p == psVar4) {
    local_e8.field_2._M_allocated_capacity = *psVar4;
    local_e8.field_2._8_8_ = plVar3[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar4;
  }
  local_e8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  lVar2 = std::ostream::tellp();
  std::__cxx11::to_string(&local_a8,lVar2 - lVar1);
  std::operator+(&local_48,&local_e8,&local_a8);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_c8 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_c8 == plVar5) {
    local_b8 = *plVar5;
    lStack_b0 = plVar3[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar5;
  }
  local_c0 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  supermap::IOException::IOException(this,(string *)&local_c8);
  __cxa_throw(this,&IOException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static void serialize(const T &value, std::ostream &os) {
        auto posBefore = os.tellp();
        os.write(reinterpret_cast<const char *>(&value), sizeof(T));
        if (os.tellp() - posBefore != sizeof(T)) {
            throw IOException(
                "Attempted to write " + std::to_string(sizeof(T)) +
                    " bytes, but only " + std::to_string(os.tellp() - posBefore) +
                    " succeeded"
            );
        }
    }